

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_client1.c
# Opt level: O1

int main(void)

{
  uint ret;
  uint32_t flags;
  ulong uVar1;
  char *__format;
  uchar *buf_00;
  mbedtls_net_context server_fd;
  mbedtls_ssl_context ssl;
  mbedtls_ssl_config conf;
  char error_buf [100];
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_x509_crt cacert;
  uchar buf [1024];
  mbedtls_entropy_context entropy;
  mbedtls_net_context local_f4c;
  mbedtls_ssl_context local_f48;
  mbedtls_ssl_config local_d90;
  char local_c18 [112];
  mbedtls_ctr_drbg_context local_ba8;
  mbedtls_x509_crt local_a50;
  uchar local_828 [1032];
  mbedtls_entropy_context local_420;
  
  mbedtls_debug_set_threshold(1);
  mbedtls_net_init(&local_f4c);
  mbedtls_ssl_init(&local_f48);
  mbedtls_ssl_config_init(&local_d90);
  mbedtls_x509_crt_init(&local_a50);
  mbedtls_ctr_drbg_init(&local_ba8);
  printf("\n  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_entropy_init(&local_420);
  ret = mbedtls_ctr_drbg_seed(&local_ba8,mbedtls_entropy_func,&local_420,(uchar *)"ssl_client1",0xb)
  ;
  if (ret != 0) {
    __format = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
    goto LAB_0010f550;
  }
  puts(" ok");
  printf("  . Loading the CA root certificate ...");
  fflush(_stdout);
  ret = mbedtls_x509_crt_parse
                  (&local_a50,
                   (uchar *)
                   "-----BEGIN CERTIFICATE-----\r\nMIIDhzCCAm+gAwIBAgIBADANBgkqhkiG9w0BAQUFADA7MQswCQYDVQQGEwJOTDER\r\nMA8GA1UEChMIUG9sYXJTU0wxGTAXBgNVBAMTEFBvbGFyU1NMIFRlc3QgQ0EwHhcN\r\nMTEwMjEyMTQ0NDAwWhcNMjEwMjEyMTQ0NDAwWjA7MQswCQYDVQQGEwJOTDERMA8G\r\nA1UEChMIUG9sYXJTU0wxGTAXBgNVBAMTEFBvbGFyU1NMIFRlc3QgQ0EwggEiMA0G\r\nCSqGSIb3DQEBAQUAA4IBDwAwggEKAoIBAQDA3zf8F7vglp0/ht6WMn1EpRagzSHx\r\nmdTs6st8GFgIlKXsm8WL3xoemTiZhx57wI053zhdcHgH057Zk+i5clHFzqMwUqny\r\n50BwFMtEonILwuVA+T7lpg6z+exKY8C4KQB0nFc7qKUEkHHxvYPZP9al4jwqj+8n\r\nYMPGn8u67GB9t+aEMr5P+1gmIgNb1LTV+/Xjli5wwOQuvfwu7uJBVcA0Ln0kcmnL\r\nR7EUQIN9Z/SG9jGr8XmksrUuEvmEF/Bibyc+E1ixVA0hmnM3oTDPb5Lc9un8rNsu\r\nKNF+AksjoBXyOGVkCeoMbo4bF6BxyLObyavpw/LPh5aPgAIynplYb6LVAgMBAAGj\r\ngZUwgZIwDAYDVR0TBAUwAwEB/zAdBgNVHQ4EFgQUtFrkpbPe0lL2udWmlQ/rPrzH\r\n/f8wYwYDVR0jBFwwWoAUtFrkpbPe0lL2udWmlQ/rPrzH/f+hP6Q9MDsxCzAJBgNV\r\nBAYTAk5MMREwDwYDVQQKEwhQb2xhclNTTDEZMBcGA1UEAxMQUG9sYXJTU0wgVGVz\r\ndCBDQYIBADANBgkqhkiG9w0BAQUFAAOCAQEAuP1U2ABUkIslsCfdlc2i94QHHYeJ\r\nSsR4EdgHtdciUI5I62J6Mom+Y0dT/7a+8S6MVMCZP6C5NyNyXw1GWY/YR82XTJ8H\r\nDBJiCTok5DbZ6SzaONBzdWHXwWwmi5vg1dxn7YxrM9d0IjxM27WNKs4sDQhZBQkF\r\npjmfs2cb4oPl4Y9T9meTx/lvdkRYEug61Jfn6cA+qHpyPYdTH+UshITnmp5/Ztkf\r\nm/UTSLBNFNHesiTZeH31NcxYGdHSme9Nc/gfidRa0FLOCfWxRlFqAI47zG9jAQCZ\r\n7Z2mCGDNMhjQc+BYcdnl0lPXjdDK6V0qCg1dVewhUBcW5gZKzV7e9+DpVA==\r\n-----END CERTIFICATE-----\r\n-----BEGIN CERTIFICATE-----\r\nMIICUjCCAdegAwIBAgIJAMFD4n5iQ8zoMAoGCCqGSM49BAMCMD4xCzAJBgNVBAYT\r\nAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UEAxMTUG9sYXJzc2wgVGVzdCBF\r\nQyBDQTAeFw0xMzA5MjQxNTQ5NDhaFw0yMzA5MjIxNTQ5NDhaMD4xCzAJBgNVBAYT\r\nAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UEAxMTUG9sYXJzc2wgVGVzdCBF\r\nQyBDQTB2MBAGByqGSM49AgEGBSuBBAAiA2IABMPaKzRBN1gvh1b+/Im6KUNLTuBu\r\nww5XUzM5WNRStJGVOQsj318XJGJI/BqVKc4sLYfCiFKAr9ZqqyHduNMcbli4yuiy\r\naY7zQa0pw7RfdadHb9UZKVVpmlM7ILRmFmAzHqOBoDCBnTAdBgNVHQ4EFgQUnW0g\r\nJEkBPyvLeLUZvH4kydv7NnwwbgYDVR0jBGcwZYAUnW0gJEkBPyvLeLUZvH4kydv7\r\nNnyhQqRAMD4xCzAJBgNVBAYTAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UE\r\nAxMTUG9sYXJzc2wgVGVzdCBFQyBDQYIJAMFD4n5iQ8zoMAwGA1UdEwQFMAMBAf8w\r\nCgYIKoZIzj0EAwIDaQAwZgIxAMO0YnNWKJUAfXgSJtJxexn4ipg+k..." /* TRUNCATED STRING LITERAL */
                   ,0x88d);
  if (-1 < (int)ret) {
    printf(" ok (%d skipped)\n",(ulong)ret);
    printf("  . Connecting to tcp/%s/%s...","localhost","4433");
    fflush(_stdout);
    ret = mbedtls_net_connect(&local_f4c,"localhost","4433",0);
    if (ret == 0) {
      puts(" ok");
      printf("  . Setting up the SSL/TLS structure...");
      fflush(_stdout);
      ret = mbedtls_ssl_config_defaults(&local_d90,0,0,0);
      if (ret == 0) {
        puts(" ok");
        mbedtls_ssl_conf_authmode(&local_d90,1);
        mbedtls_ssl_conf_ca_chain(&local_d90,&local_a50,(mbedtls_x509_crl *)0x0);
        mbedtls_ssl_conf_rng(&local_d90,mbedtls_ctr_drbg_random,&local_ba8);
        mbedtls_ssl_conf_dbg(&local_d90,my_debug,_stdout);
        ret = mbedtls_ssl_setup(&local_f48,&local_d90);
        if (ret == 0) {
          ret = mbedtls_ssl_set_hostname(&local_f48,"localhost");
          if (ret == 0) {
            mbedtls_ssl_set_bio(&local_f48,&local_f4c,mbedtls_net_send,mbedtls_net_recv,
                                (mbedtls_ssl_recv_timeout_t *)0x0);
            printf("  . Performing the SSL/TLS handshake...");
            fflush(_stdout);
            do {
              ret = mbedtls_ssl_handshake(&local_f48);
              if (ret == 0) {
                puts(" ok");
                printf("  . Verifying peer X.509 certificate...");
                flags = mbedtls_ssl_get_verify_result(&local_f48);
                if (flags == 0) {
                  buf_00 = " ok";
                }
                else {
                  puts(" failed");
                  buf_00 = local_828;
                  mbedtls_x509_crt_verify_info((char *)buf_00,0x200,"  ! ",flags);
                }
                puts((char *)buf_00);
                printf("  > Write to server:");
                fflush(_stdout);
                builtin_memcpy(local_828,"GET / HTTP/1.0\r\n\r\n",0x13);
                goto LAB_0010f87d;
              }
            } while ((ret & 0xffffff7f) == 0xffff9700);
            uVar1 = (ulong)-ret;
            __format = " failed\n  ! mbedtls_ssl_handshake returned -0x%x\n\n";
            goto LAB_0010f552;
          }
          __format = " failed\n  ! mbedtls_ssl_set_hostname returned %d\n\n";
        }
        else {
          __format = " failed\n  ! mbedtls_ssl_setup returned %d\n\n";
        }
      }
      else {
        __format = " failed\n  ! mbedtls_ssl_config_defaults returned %d\n\n";
      }
    }
    else {
      __format = " failed\n  ! mbedtls_net_connect returned %d\n\n";
    }
    goto LAB_0010f550;
  }
  uVar1 = (ulong)-ret;
  __format = " failed\n  !  mbedtls_x509_crt_parse returned -0x%x\n\n";
  goto LAB_0010f552;
LAB_0010f8eb:
  do {
    memset(local_828,0,0x400);
    ret = mbedtls_ssl_read(&local_f48,local_828,0x3ff);
  } while ((ret & 0xffffff7f) == 0xffff9700);
  if (ret == 0xffff8780) goto LAB_0010f955;
  if ((int)ret < 0) {
    printf("failed\n  ! mbedtls_ssl_read returned %d\n\n",(ulong)ret);
    goto LAB_0010f955;
  }
  if (ret != 0) {
    printf(" %d bytes read\n\n%s",(ulong)ret,local_828);
    goto LAB_0010f8eb;
  }
  puts("\n\nEOF\n");
LAB_0010f955:
  mbedtls_ssl_close_notify(&local_f48);
  goto LAB_0010f559;
  while ((ret & 0xffffff7f) == 0xffff9700) {
LAB_0010f87d:
    ret = mbedtls_ssl_write(&local_f48,local_828,0x12);
    if (0 < (int)ret) {
      printf(" %d bytes written\n\n%s",(ulong)ret,local_828);
      printf("  < Read from server:");
      fflush(_stdout);
      goto LAB_0010f8eb;
    }
  }
  __format = " failed\n  ! mbedtls_ssl_write returned %d\n\n";
LAB_0010f550:
  uVar1 = (ulong)ret;
LAB_0010f552:
  printf(__format,uVar1);
LAB_0010f559:
  if (ret != 0) {
    mbedtls_strerror(ret,local_c18,100);
    printf("Last error was: %d - %s\n\n",(ulong)ret,local_c18);
  }
  mbedtls_net_free(&local_f4c);
  mbedtls_x509_crt_free(&local_a50);
  mbedtls_ssl_free(&local_f48);
  mbedtls_ssl_config_free(&local_d90);
  mbedtls_ctr_drbg_free(&local_ba8);
  mbedtls_entropy_free(&local_420);
  return ret;
}

Assistant:

int main( void )
{
    int ret, len;
    mbedtls_net_context server_fd;
    uint32_t flags;
    unsigned char buf[1024];
    const char *pers = "ssl_client1";

    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_ssl_context ssl;
    mbedtls_ssl_config conf;
    mbedtls_x509_crt cacert;

#if defined(MBEDTLS_DEBUG_C)
    mbedtls_debug_set_threshold( DEBUG_LEVEL );
#endif

    /*
     * 0. Initialize the RNG and the session data
     */
    mbedtls_net_init( &server_fd );
    mbedtls_ssl_init( &ssl );
    mbedtls_ssl_config_init( &conf );
    mbedtls_x509_crt_init( &cacert );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 0. Initialize certificates
     */
    mbedtls_printf( "  . Loading the CA root certificate ..." );
    fflush( stdout );

    ret = mbedtls_x509_crt_parse( &cacert, (const unsigned char *) mbedtls_test_cas_pem,
                          mbedtls_test_cas_pem_len );
    if( ret < 0 )
    {
        mbedtls_printf( " failed\n  !  mbedtls_x509_crt_parse returned -0x%x\n\n", -ret );
        goto exit;
    }

    mbedtls_printf( " ok (%d skipped)\n", ret );

    /*
     * 1. Start the connection
     */
    mbedtls_printf( "  . Connecting to tcp/%s/%s...", SERVER_NAME, SERVER_PORT );
    fflush( stdout );

    if( ( ret = mbedtls_net_connect( &server_fd, SERVER_NAME,
                                         SERVER_PORT, MBEDTLS_NET_PROTO_TCP ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_connect returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 2. Setup stuff
     */
    mbedtls_printf( "  . Setting up the SSL/TLS structure..." );
    fflush( stdout );

    if( ( ret = mbedtls_ssl_config_defaults( &conf,
                    MBEDTLS_SSL_IS_CLIENT,
                    MBEDTLS_SSL_TRANSPORT_STREAM,
                    MBEDTLS_SSL_PRESET_DEFAULT ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ssl_config_defaults returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /* OPTIONAL is not optimal for security,
     * but makes interop easier in this simplified example */
    mbedtls_ssl_conf_authmode( &conf, MBEDTLS_SSL_VERIFY_OPTIONAL );
    mbedtls_ssl_conf_ca_chain( &conf, &cacert, NULL );
    mbedtls_ssl_conf_rng( &conf, mbedtls_ctr_drbg_random, &ctr_drbg );
    mbedtls_ssl_conf_dbg( &conf, my_debug, stdout );

    if( ( ret = mbedtls_ssl_setup( &ssl, &conf ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ssl_setup returned %d\n\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_ssl_set_hostname( &ssl, SERVER_NAME ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ssl_set_hostname returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_ssl_set_bio( &ssl, &server_fd, mbedtls_net_send, mbedtls_net_recv, NULL );

    /*
     * 4. Handshake
     */
    mbedtls_printf( "  . Performing the SSL/TLS handshake..." );
    fflush( stdout );

    while( ( ret = mbedtls_ssl_handshake( &ssl ) ) != 0 )
    {
        if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_handshake returned -0x%x\n\n", -ret );
            goto exit;
        }
    }

    mbedtls_printf( " ok\n" );

    /*
     * 5. Verify the server certificate
     */
    mbedtls_printf( "  . Verifying peer X.509 certificate..." );

    /* In real life, we probably want to bail out when ret != 0 */
    if( ( flags = mbedtls_ssl_get_verify_result( &ssl ) ) != 0 )
    {
        char vrfy_buf[512];

        mbedtls_printf( " failed\n" );

        mbedtls_x509_crt_verify_info( vrfy_buf, sizeof( vrfy_buf ), "  ! ", flags );

        mbedtls_printf( "%s\n", vrfy_buf );
    }
    else
        mbedtls_printf( " ok\n" );

    /*
     * 3. Write the GET request
     */
    mbedtls_printf( "  > Write to server:" );
    fflush( stdout );

    len = sprintf( (char *) buf, GET_REQUEST );

    while( ( ret = mbedtls_ssl_write( &ssl, buf, len ) ) <= 0 )
    {
        if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_write returned %d\n\n", ret );
            goto exit;
        }
    }

    len = ret;
    mbedtls_printf( " %d bytes written\n\n%s", len, (char *) buf );

    /*
     * 7. Read the HTTP response
     */
    mbedtls_printf( "  < Read from server:" );
    fflush( stdout );

    do
    {
        len = sizeof( buf ) - 1;
        memset( buf, 0, sizeof( buf ) );
        ret = mbedtls_ssl_read( &ssl, buf, len );

        if( ret == MBEDTLS_ERR_SSL_WANT_READ || ret == MBEDTLS_ERR_SSL_WANT_WRITE )
            continue;

        if( ret == MBEDTLS_ERR_SSL_PEER_CLOSE_NOTIFY )
            break;

        if( ret < 0 )
        {
            mbedtls_printf( "failed\n  ! mbedtls_ssl_read returned %d\n\n", ret );
            break;
        }

        if( ret == 0 )
        {
            mbedtls_printf( "\n\nEOF\n\n" );
            break;
        }

        len = ret;
        mbedtls_printf( " %d bytes read\n\n%s", len, (char *) buf );
    }
    while( 1 );

    mbedtls_ssl_close_notify( &ssl );

exit:

#ifdef MBEDTLS_ERROR_C
    if( ret != 0 )
    {
        char error_buf[100];
        mbedtls_strerror( ret, error_buf, 100 );
        mbedtls_printf("Last error was: %d - %s\n\n", ret, error_buf );
    }
#endif

    mbedtls_net_free( &server_fd );

    mbedtls_x509_crt_free( &cacert );
    mbedtls_ssl_free( &ssl );
    mbedtls_ssl_config_free( &conf );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}